

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O1

void __thiscall RasterizerA2::clear(RasterizerA2 *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Bounds *pBVar5;
  Cell *pCVar6;
  ulong uVar7;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar1 = (this->_yBounds).start;
    uVar7 = (ulong)(int)uVar1;
    uVar2 = (this->_yBounds).end;
    if (uVar1 <= uVar2) {
      pCVar6 = this->_cells + this->_cellStride * uVar7;
      do {
        iVar3 = this->_xBounds[uVar7].start;
        iVar4 = this->_xBounds[uVar7].end;
        if (iVar3 <= iVar4) {
          memset(pCVar6 + iVar3,0,(long)((iVar4 - iVar3) + 1) << 3);
          pBVar5 = this->_xBounds;
          pBVar5[uVar7].start = 0x7fffffff;
          pBVar5[uVar7].end = 0;
        }
        pCVar6 = pCVar6 + this->_cellStride;
        uVar7 = uVar7 + 1;
      } while (uVar7 <= (ulong)(long)(int)uVar2);
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }